

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptPostQualifier(HlslGrammar *this,TQualifier *qualifier)

{
  EHlslTokenClass EVar1;
  TQualifier *qualifier_local;
  HlslGrammar *this_local;
  
  while (EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream), EVar1 == EHTokConst) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 2;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptPostQualifier(TQualifier& qualifier)
{
    do {
        switch (peek()) {
        case EHTokConst:
            qualifier.storage = EvqConst;
            break;
        default:
            return true;
        }
        advanceToken();
    } while (true);
}